

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  uint uVar1;
  unsigned_long_long *puVar2;
  unsigned_short *puVar3;
  uint16 i;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint16 i_1;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint8 D6 [4096];
  elemental_vector local_1078;
  vector<unsigned_short> *local_1060;
  elemental_vector local_1058;
  crn_comp *local_1040;
  byte abStack_1038 [4104];
  
  local_1060 = this->m_selector_remaping + 1;
  uVar1 = (this->m_alpha_selectors).m_size;
  uVar13 = uVar1 & 0xffff;
  uVar9 = this->m_selector_remaping[1].m_size;
  if (uVar9 != uVar13) {
    if (uVar9 <= uVar13) {
      if (this->m_selector_remaping[1].m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_1060,uVar13,uVar9 + 1 == uVar13,2,(object_mover)0x0,
                   false);
      }
      uVar9 = this->m_selector_remaping[1].m_size;
      memset(this->m_selector_remaping[1].m_p + uVar9,0,(ulong)(uVar13 - uVar9) * 2);
    }
    this->m_selector_remaping[1].m_size = uVar13;
  }
  uVar4 = 0;
  do {
    abStack_1038[uVar4] =
         (&DAT_001abe4b)[(uint)(uVar4 >> 3) & 7 ^ (uint)(uVar4 >> 9) & 0x7fffff] +
         (&DAT_001abe4b)[((uint)(uVar4 >> 6) & 0x3ffffff ^ (uint)uVar4) & 7];
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x1000);
  local_1058.m_p = (void *)0x0;
  local_1058.m_size = 0;
  local_1058.m_capacity = 0;
  if (uVar13 == 0) {
    local_1078.m_p = (void *)0x0;
    local_1078.m_size = 0;
    local_1078.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_1058,uVar13,uVar13 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_1058._8_8_ & 0xffffffff) * 8 + (long)local_1058.m_p),0,
           (ulong)(uVar13 - local_1058.m_size) << 3);
    local_1058._8_8_ = CONCAT44(local_1058.m_capacity,uVar1) & 0xffffffff0000ffff;
    local_1078.m_p = (void *)0x0;
    local_1078.m_size = 0;
    local_1078.m_capacity = 0;
    elemental_vector::increase_capacity(&local_1078,uVar13,uVar13 == 1,2,(object_mover)0x0,false);
    memset((void *)((local_1078._8_8_ & 0xffffffff) * 2 + (long)local_1078.m_p),0,
           (ulong)(uVar13 - local_1078.m_size) * 2);
    local_1078._8_8_ = CONCAT44(local_1078.m_capacity,uVar1) & 0xffffffff0000ffff;
    puVar2 = (this->m_alpha_selectors).m_p;
    uVar4 = 0;
    do {
      *(unsigned_long_long *)((long)local_1058.m_p + uVar4 * 8) = puVar2[uVar4];
      *(short *)((long)local_1078.m_p + uVar4 * 2) = (short)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar13 != uVar4);
  }
  if ((short)uVar1 != 0) {
    puVar3 = local_1060->m_p;
    uVar7 = (ulong)(uVar1 & 0xffff);
    uVar4 = 0;
    do {
      uVar9 = 0xffffffff;
      uVar11 = 0;
      uVar10 = 0;
      do {
        uVar5 = *(long *)((long)local_1058.m_p + uVar11 * 8) << 6;
        lVar12 = 8;
        uVar13 = 0;
        uVar8 = uVar4;
        do {
          uVar13 = uVar13 + abStack_1038[(uint)uVar8 & 0x3f | (uint)uVar5 & 0xfc0];
          uVar5 = uVar5 >> 6;
          uVar8 = uVar8 >> 6;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar6 = (uint)uVar11;
        if (uVar9 <= uVar13) {
          uVar6 = (uint)uVar10;
        }
        uVar10 = (ulong)uVar6;
        if (uVar9 > uVar13) {
          uVar9 = uVar13;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar7);
      uVar10 = uVar10 & 0xffff;
      uVar4 = *(ulong *)((long)local_1058.m_p + uVar10 * 8);
      puVar3[*(ushort *)((long)local_1078.m_p + uVar10 * 2)] = (short)uVar1 - (short)uVar7;
      *(undefined8 *)((long)local_1058.m_p + uVar10 * 8) =
           *(undefined8 *)((long)local_1058.m_p + uVar7 * 8 + -8);
      *(undefined2 *)((long)local_1078.m_p + uVar10 * 2) =
           *(undefined2 *)((long)local_1078.m_p + uVar7 * 2 + -2);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  local_1040 = this;
  pack_alpha_selectors(this,&this->m_packed_alpha_selectors,local_1060);
  if (local_1078.m_p != (void *)0x0) {
    crnlib_free(local_1078.m_p);
  }
  if (local_1058.m_p != (void *)0x0) {
    crnlib_free(local_1058.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
        uint16 n = m_alpha_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 2, 3, 3, 5, 5, 4, 4 };

        uint8 D6[0x1000];
        for (uint16 i = 0; i < 0x1000; i++)
        {
            D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];
        }

        crnlib::vector<uint64> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_alpha_selectors[i];
            indices[i] = i;
        }
        uint64 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint error = 0;
                for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
                {
                    error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
                }
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_alpha_selectors(m_packed_alpha_selectors, remapping);
    }